

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

int __thiscall GrcSymbolTableEntry::GlyphMetricEngineCodeOp(GrcSymbolTableEntry *this)

{
  bool bVar1;
  int iVar2;
  GrcSymbolTableEntry *this_00;
  string local_80;
  string local_60;
  string local_40;
  
  do {
    this_00 = this;
    if (this_00->m_fGeneric != false) break;
    this = this_00->m_psymGeneric;
  } while (this_00->m_psymGeneric != (Symbol)0x0);
  FieldAt_abi_cxx11_(&local_80,this_00,0);
  FieldAt_abi_cxx11_(&local_60,this_00,1);
  FieldAt_abi_cxx11_(&local_40,this_00,2);
  bVar1 = std::operator==(&local_80,"leftsidebearing");
  iVar2 = 0;
  if ((bVar1) || (bVar1 = std::operator==(&local_80,"rightsidebearing"), iVar2 = 1, bVar1))
  goto LAB_001513da;
  bVar1 = std::operator==(&local_80,"boundingbox");
  if (bVar1) {
    bVar1 = std::operator==(&local_60,"top");
    iVar2 = 2;
    if (bVar1) goto LAB_001513da;
    bVar1 = std::operator==(&local_60,"bottom");
    if (bVar1) {
      iVar2 = 3;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_60,"left");
    if (bVar1) {
      iVar2 = 4;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_60,"right");
    if (bVar1) {
      iVar2 = 5;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_60,"width");
    if (bVar1) {
      iVar2 = 7;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_60,"height");
    if (bVar1) {
      iVar2 = 6;
      goto LAB_001513da;
    }
  }
  else {
    bVar1 = std::operator==(&local_80,"advancewidth");
    if (bVar1) {
      iVar2 = 8;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_80,"advanceheight");
    if (bVar1) {
      iVar2 = 9;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_80,"ascent");
    if (bVar1) {
      iVar2 = 10;
      goto LAB_001513da;
    }
    bVar1 = std::operator==(&local_80,"descent");
    if (bVar1) {
      iVar2 = 0xb;
      goto LAB_001513da;
    }
  }
  iVar2 = -1;
LAB_001513da:
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return iVar2;
}

Assistant:

int GrcSymbolTableEntry::GlyphMetricEngineCodeOp()
{
	if (!m_fGeneric && m_psymGeneric)
		return m_psymGeneric->GlyphMetricEngineCodeOp();

	Assert(FitsSymbolType(ksymtGlyphMetric)) ;

	std::string staField0 = FieldAt(0);
	std::string staField1 = FieldAt(1);
	std::string staField2 = FieldAt(2);

	if (staField0 == "leftsidebearing")
	{
		return kgmetLsb;
	}
	else if (staField0 == "rightsidebearing")
	{
		return kgmetRsb;
	}
	else if (staField0 == "boundingbox")
	{
		if (staField1 == "top")
			return kgmetBbTop;
		else if (staField1 == "bottom")
			return kgmetBbBottom;
		else if (staField1 == "left")
			return kgmetBbLeft;
		else if (staField1 == "right")
			return kgmetBbRight;
		else if (staField1 == "width")
			return kgmetBbWidth;
		else if (staField1 == "height")
			return kgmetBbHeight;
		else
		{
			Assert(false);
		}
	}
	else if (staField0 == "advancewidth")
	{
		return kgmetAdvWidth;
	}
	else if (staField0 == "advanceheight")
	{
		return kgmetAdvHeight;
	}
//	else if (staField0 == "advance")
//	{
//		if (staField1 == "width")
//			return kgmetAdvWidth;
//		else if (staField1 == "height")
//			return kgmetAdvHeight;
//		else
//			Assert(false);
//	}
	else if (staField0 == "ascent")
	{
		return kgmetAscent;
	}
	else if (staField0 == "descent")
	{
		return kgmetDescent;
	}
	else
	{
		Assert(false);
    }
	return -1;
}